

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RBJ.cpp
# Opt level: O2

void __thiscall Iir::RBJ::AllPass::setupN(AllPass *this,double phaseFrequency,double q)

{
  double dVar1;
  double dVar2;
  double a2;
  
  dVar1 = cos(phaseFrequency * 6.283185307179586);
  dVar2 = sin(phaseFrequency * 6.283185307179586);
  dVar2 = dVar2 / (q + q);
  a2 = 1.0 - dVar2;
  dVar2 = dVar2 + 1.0;
  Biquad::setCoefficients((Biquad *)this,dVar2,dVar1 * -2.0,a2,a2,dVar1 * -2.0,dVar2);
  return;
}

Assistant:

void AllPass::setupN (double phaseFrequency,
                     double q)
{
	double w0 = 2 * doublePi * phaseFrequency;
	double cs = cos (w0);
	double sn = sin (w0);
	double AL = sn / ( 2 * q );
	double b0 =  1 - AL;
	double b1 = -2 * cs;
	double b2 =  1 + AL;
	double a0 =  1 + AL;
	double a1 = -2 * cs;
	double a2 =  1 - AL;
	setCoefficients (a0, a1, a2, b0, b1, b2);
}